

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O0

void __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::RestrictLastObjVal
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  AlgConRange rng;
  AlgConRange rng_00;
  bool bVar1;
  Type TVar2;
  int expr;
  reference __a;
  reference pvVar3;
  double *pdVar4;
  size_t sVar5;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *this_00;
  LinTerms *pLVar6;
  long in_RDI;
  double dVar7;
  double u;
  NodeRange NVar8;
  double diff;
  double lim;
  value_type *obj_last;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_ffffffffffffefc0;
  LinTerms *in_stack_ffffffffffffefc8;
  QuadTerms *in_stack_ffffffffffffefd0;
  LinTerms *in_stack_ffffffffffffefd8;
  undefined1 uVar9;
  QuadAndLinTerms *in_stack_ffffffffffffefe0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_ffffffffffffefe8;
  AlgConRhs<1> in_stack_ffffffffffffeff0;
  undefined1 in_stack_fffffffffffff063;
  int in_stack_fffffffffffff064;
  LinTerms *in_stack_fffffffffffff068;
  NLConstraint *in_stack_fffffffffffff070;
  double in_stack_fffffffffffff078;
  double in_stack_fffffffffffff080;
  double local_f50;
  AlgConRhs<_1> local_f38 [36];
  NodeRange local_e18;
  AlgConRhs<1> local_e08 [36];
  NodeRange local_ce8;
  AlgConRhs<_1> local_cd8 [171];
  NodeRange local_780;
  AlgConRhs<1> local_770 [171];
  NodeRange local_218;
  AlgConRange local_208 [14];
  NodeRange local_128;
  AlgConRange local_108;
  NLConstraint local_f8;
  double local_28;
  double local_20;
  double local_18;
  reference local_10;
  
  local_10 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::
             operator[]((vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_> *)
                        (in_RDI + 8),(long)(*(int *)(in_RDI + 0x50) + -1));
  local_18 = *(double *)(in_RDI + 0x58);
  __a = std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                   (long)(*(int *)(in_RDI + 0x50) + -1));
  dVar7 = ABS(local_18);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),
                      (long)(*(int *)(in_RDI + 0x50) + -1));
  local_28 = dVar7 * *pvVar3;
  pdVar4 = std::max<double>(__a,&local_28);
  dVar7 = *pdVar4;
  local_20 = dVar7;
  TVar2 = LinearObjective::obj_sense((LinearObjective *)local_10);
  local_f50 = -1.0;
  if (TVar2 != MAX) {
    local_f50 = 1.0;
  }
  local_18 = dVar7 * local_f50 + local_18;
  bVar1 = NLObjective::HasExpr(&local_10->super_NLObjective);
  if (bVar1) {
    TVar2 = LinearObjective::obj_sense((LinearObjective *)local_10);
    if (TVar2 == MAX) {
      pLVar6 = (LinTerms *)(in_RDI + -0x1a8);
      LinearObjective::GetLinTerms((LinearObjective *)local_10);
      expr = NLObjective::ExprIndex(&local_10->super_NLObjective);
      dVar7 = local_18;
      u = FlatModel<mp::DefaultFlatModelParams>::Inf();
      AlgConRange::AlgConRange(&local_108,dVar7,u);
      rng.ub_ = in_stack_fffffffffffff080;
      rng.lb_ = in_stack_fffffffffffff078;
      NLConstraint::NLConstraint(&local_f8,pLVar6,expr,rng,(bool)in_stack_fffffffffffff063);
      local_128 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::AddConstraint<mp::NLConstraint>
                            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)in_stack_ffffffffffffeff0.rhs_,
                             (NLConstraint *)in_stack_ffffffffffffefe8);
      NLConstraint::~NLConstraint((NLConstraint *)in_stack_ffffffffffffefc0);
    }
    else {
      LinearObjective::GetLinTerms((LinearObjective *)local_10);
      NLObjective::ExprIndex(&local_10->super_NLObjective);
      dVar7 = FlatModel<mp::DefaultFlatModelParams>::MinusInf();
      AlgConRange::AlgConRange(local_208,dVar7,local_18);
      rng_00.ub_ = in_stack_fffffffffffff080;
      rng_00.lb_ = in_stack_fffffffffffff078;
      NLConstraint::NLConstraint
                (in_stack_fffffffffffff070,in_stack_fffffffffffff068,in_stack_fffffffffffff064,
                 rng_00,(bool)in_stack_fffffffffffff063);
      local_218 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::AddConstraint<mp::NLConstraint>
                            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)in_stack_ffffffffffffeff0.rhs_,
                             (NLConstraint *)in_stack_ffffffffffffefe8);
      NLConstraint::~NLConstraint((NLConstraint *)in_stack_ffffffffffffefc0);
    }
  }
  else {
    QuadraticObjective::GetQPTerms(local_10);
    sVar5 = QuadTerms::size((QuadTerms *)0x3d52b5);
    if (sVar5 == 0) {
      TVar2 = LinearObjective::obj_sense((LinearObjective *)local_10);
      uVar9 = (undefined1)((ulong)in_stack_ffffffffffffefd8 >> 0x38);
      if (TVar2 == MAX) {
        this_00 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)(in_RDI + -0x1a8);
        LinearObjective::GetLinTerms((LinearObjective *)local_10);
        LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        AlgConRhs<1>::AlgConRhs(local_e08,local_18);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  (this_00,&in_stack_ffffffffffffefe0->super_LinTerms,in_stack_ffffffffffffeff0,
                   (bool)uVar9);
        local_e18 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)in_stack_ffffffffffffeff0.rhs_,this_00);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_ffffffffffffefc0
                  );
        LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffefc0);
      }
      else {
        pLVar6 = (LinTerms *)(in_RDI + -0x1a8);
        LinearObjective::GetLinTerms((LinearObjective *)local_10);
        LinTerms::LinTerms(pLVar6,in_stack_ffffffffffffefc8);
        AlgConRhs<-1>::AlgConRhs(local_f38,local_18);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_ffffffffffffefe8,&in_stack_ffffffffffffefe0->super_LinTerms,
                   (AlgConRhs<_1>)in_stack_ffffffffffffeff0.rhs_,(bool)uVar9);
        NVar8 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                          ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)in_stack_ffffffffffffeff0.rhs_,
                           (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                           in_stack_ffffffffffffefe8);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)NVar8.ir_);
        LinTerms::~LinTerms((LinTerms *)NVar8.ir_);
      }
    }
    else {
      TVar2 = LinearObjective::obj_sense((LinearObjective *)local_10);
      if (TVar2 == MAX) {
        LinearObjective::GetLinTerms((LinearObjective *)local_10);
        LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        QuadraticObjective::GetQPTerms(local_10);
        QuadTerms::QuadTerms
                  ((QuadTerms *)in_stack_ffffffffffffeff0.rhs_,
                   (QuadTerms *)in_stack_ffffffffffffefe8);
        QuadAndLinTerms::QuadAndLinTerms
                  (in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
        uVar9 = (undefined1)((ulong)in_stack_ffffffffffffefd8 >> 0x38);
        AlgConRhs<1>::AlgConRhs(local_770,local_18);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                   in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,in_stack_ffffffffffffeff0,
                   (bool)uVar9);
        local_780 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)in_stack_ffffffffffffeff0.rhs_,
                               (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                               in_stack_ffffffffffffefe8);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                   in_stack_ffffffffffffefc0);
        QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffefc0);
        QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffefc0);
        LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffefc0);
      }
      else {
        LinearObjective::GetLinTerms((LinearObjective *)local_10);
        LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        QuadraticObjective::GetQPTerms(local_10);
        QuadTerms::QuadTerms
                  ((QuadTerms *)in_stack_ffffffffffffeff0.rhs_,
                   (QuadTerms *)in_stack_ffffffffffffefe8);
        QuadAndLinTerms::QuadAndLinTerms
                  (in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
        uVar9 = (undefined1)((ulong)in_stack_ffffffffffffefd8 >> 0x38);
        AlgConRhs<-1>::AlgConRhs(local_cd8,local_18);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  (in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                   (AlgConRhs<_1>)in_stack_ffffffffffffeff0.rhs_,(bool)uVar9);
        local_ce8 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)in_stack_ffffffffffffeff0.rhs_,in_stack_ffffffffffffefe8);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  (in_stack_ffffffffffffefc0);
        QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffefc0);
        QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffefc0);
        LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffefc0);
      }
    }
  }
  return;
}

Assistant:

void RestrictLastObjVal() {
    assert(i_current_obj_ && i_current_obj_<obj_new_.size());
    const auto& obj_last = obj_new_[i_current_obj_-1];
    auto lim = objval_last_;
    auto diff = std::max(                 // Apply degradation tolerance
        obj_new_tola_[i_current_obj_-1], std::fabs(lim) * obj_new_tolr_[i_current_obj_-1]);
    lim += diff * (obj::MAX==obj_last.obj_sense() ? -1.0 : 1.0);
    if (obj_last.HasExpr()) {
      assert(obj_last.GetQPTerms().empty());   // not mixing QP and expression term
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
            NLConstraint{ obj_last.GetLinTerms(), obj_last.ExprIndex(),
                         { lim, MPCD(Inf()) } } ) );
      else
        MPD( AddConstraint(
            NLConstraint{ obj_last.GetLinTerms(), obj_last.ExprIndex(),
                         { MPCD(MinusInf()), lim } } ) );
    } else    if (obj_last.GetQPTerms().size()) {
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
						QuadConGE{ { obj_last.GetLinTerms(), obj_last.GetQPTerms() }, lim } ) );
      else
        MPD( AddConstraint(
						QuadConLE{ { obj_last.GetLinTerms(), obj_last.GetQPTerms() }, lim } ) );
    } else {
      if (obj::MAX == obj_last.obj_sense())
        MPD( AddConstraint(
						LinConGE{ { obj_last.GetLinTerms() }, lim } ) );
      else
        MPD( AddConstraint(
						LinConLE{ { obj_last.GetLinTerms() }, lim } ) );
    }
  }